

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::operator()
          (AccessorVerifier *this,size_t param_2,char *param_3)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  size_t local_a8;
  char *local_a0;
  string_view local_90;
  size_t local_80;
  char *local_78;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_68;
  size_t local_58;
  char *local_50;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_48;
  size_t local_38;
  char *local_30;
  AccessorVerifier *local_28;
  AccessorVerifier *this_local;
  size_t local_18;
  string_view label_local;
  
  local_38 = param_2;
  local_30 = param_3;
  local_28 = this;
  local_18 = param_2;
  label_local._M_len = (size_t)param_3;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"name");
  __x_01._M_str = local_30;
  __x_01._M_len = local_38;
  bVar1 = std::operator==(__x_01,local_48);
  if (!bVar1) {
    local_58 = local_18;
    local_50 = (char *)label_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,"release_name");
    __x_00._M_str = local_50;
    __x_00._M_len = local_58;
    bVar1 = std::operator==(__x_00,local_68);
    if (!bVar1) {
      local_80 = local_18;
      local_78 = (char *)label_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"annotate")
      ;
      text._M_str = local_78;
      text._M_len = local_80;
      bVar1 = absl::lts_20250127::StartsWith(text,local_90);
      if (bVar1) {
        SetTracker(this,this,0);
        return;
      }
      local_a8 = local_18;
      local_a0 = (char *)label_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_b8,"WeakDescriptorSelfPin");
      __x._M_str = local_a0;
      __x._M_len = local_a8;
      bVar1 = std::operator==(__x,local_b8);
      if (!bVar1) {
        return;
      }
      SetTracker(this,&this->needs_weak_descriptor_pin_,0);
      return;
    }
  }
  SetTracker(this,this,1);
  SetTracker(this,&this->needs_weak_descriptor_pin_,1);
  return;
}

Assistant:

void operator()(absl::string_view label, io::Printer::SourceLocation loc) {
    if (label == "name" || label == "release_name") {
      // All accessors use $name$ or $release_name$ when constructing the
      // function name. We hook into those to determine that an accessor is
      // starting.
      SetTracker(needs_annotate_, true, loc);
      SetTracker(needs_weak_descriptor_pin_, true, loc);
      loc_ = loc;
    } else if (absl::StartsWith(label, "annotate")) {
      // All annotation labels start with `annotate`. Eg `annotate_get`.
      SetTracker(needs_annotate_, false, loc);
      loc_ = loc;
    } else if (label == "WeakDescriptorSelfPin") {
      // The self pin for weak descriptor types must be on every accessor.
      SetTracker(needs_weak_descriptor_pin_, false, loc);
      loc_ = loc;
    }
  }